

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O0

either * toml::detail::syntax::integer(spec *s)

{
  either *in_RDI;
  spec *in_stack_00000018;
  spec *in_stack_00000048;
  spec *in_stack_00000068;
  spec *in_stack_000000d8;
  either *this;
  sequence *in_stack_ffffffffffffff60;
  sequence *in_stack_ffffffffffffff68;
  sequence *in_stack_ffffffffffffff70;
  sequence *in_stack_ffffffffffffff78;
  either *in_stack_ffffffffffffff80;
  
  this = in_RDI;
  hex_int(in_stack_00000068);
  oct_int(in_stack_00000018);
  bin_int(in_stack_00000048);
  dec_int(in_stack_000000d8);
  either::
  either<toml::detail::sequence,toml::detail::sequence,toml::detail::sequence,toml::detail::sequence>
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
             in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  sequence::~sequence((sequence *)this);
  sequence::~sequence((sequence *)this);
  sequence::~sequence((sequence *)this);
  sequence::~sequence((sequence *)this);
  return in_RDI;
}

Assistant:

TOML11_INLINE either integer(const spec& s)
{
    return either(
            hex_int(s),
            oct_int(s),
            bin_int(s),
            dec_int(s)
        );
}